

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdExtension.hpp
# Opt level: O0

ostream * std::operator<<(ostream *os,vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *v)

{
  bool bVar1;
  ostream *poVar2;
  const_reference pvVar3;
  size_type sVar4;
  ulong local_28;
  size_t i;
  vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *v_local;
  ostream *os_local;
  
  bVar1 = vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::empty(v);
  if (bVar1) {
    os_local = std::operator<<(os,"[]");
  }
  else {
    poVar2 = std::operator<<(os,"[");
    pvVar3 = vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::operator[](v,0);
    cppjieba::operator<<(poVar2,pvVar3);
    local_28 = 1;
    while( true ) {
      sVar4 = vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::size(v);
      if (sVar4 <= local_28) break;
      poVar2 = std::operator<<(os,", ");
      pvVar3 = vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::operator[](v,local_28);
      cppjieba::operator<<(poVar2,pvVar3);
      local_28 = local_28 + 1;
    }
    std::operator<<(os,"]");
    os_local = os;
  }
  return os_local;
}

Assistant:

ostream& operator << (ostream& os, const vector<T>& v) {
  if(v.empty()) {
    return os << "[]";
  }
  os<<"["<<v[0];
  for(size_t i = 1; i < v.size(); i++) {
    os<<", "<<v[i];
  }
  os<<"]";
  return os;
}